

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::ParseHelper_Decode_Base64
          (AMFImporter *this,string *pInputBase64,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pOutputData)

{
  undefined8 this_00;
  value_type_conflict2 vVar1;
  ulong uVar2;
  DeadlyImportError *this_01;
  char *pcVar3;
  value_type_conflict2 *pvVar4;
  bool bVar5;
  byte local_9b;
  byte local_9a;
  byte local_99;
  uint8_t i_2;
  uint8_t i_1;
  uint8_t i;
  size_t in_idx;
  size_t in_len;
  string local_80;
  value_type_conflict2 local_5c [4];
  byte local_58 [3];
  byte local_55;
  uint8_t arr3 [3];
  uint8_t arr4 [4];
  uint8_t tidx;
  allocator<char> local_41;
  string local_40 [8];
  string base64_chars;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pOutputData_local;
  string *pInputBase64_local;
  AMFImporter *this_local;
  
  base64_chars.field_2._8_8_ = pOutputData;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",&local_41);
  std::allocator<char>::~allocator(&local_41);
  local_55 = 0;
  uVar2 = std::__cxx11::string::size();
  if ((uVar2 & 3) == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)base64_chars.field_2._8_8_);
    this_00 = base64_chars.field_2._8_8_;
    uVar2 = std::__cxx11::string::size();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(uVar2 >> 2) * 3);
    in_idx = std::__cxx11::string::size();
    while( true ) {
      bVar5 = false;
      if (in_idx != 0) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pInputBase64);
        bVar5 = *pcVar3 != '=';
      }
      if (!bVar5) break;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pInputBase64);
      bVar5 = ParseHelper_Decode_Base64_IsBase64(*pcVar3);
      if (bVar5) {
        pvVar4 = (value_type_conflict2 *)std::__cxx11::string::operator[]((ulong)pInputBase64);
        uVar2 = (ulong)local_55;
        local_55 = local_55 + 1;
        local_5c[uVar2 + 3] = *pvVar4;
        if (local_55 == 4) {
          for (local_55 = 0; local_55 < 4; local_55 = local_55 + 1) {
            vVar1 = std::__cxx11::string::find
                              ((char)local_40,(ulong)(uint)(int)(char)local_5c[(ulong)local_55 + 3])
            ;
            local_5c[(ulong)local_55 + 3] = vVar1;
          }
          local_5c[0] = local_5c[3] * '\x04' + (char)((int)(local_58[0] & 0x30) >> 4);
          local_5c[1] = local_58[0] * '\x10' + (char)((int)(local_58[1] & 0x3c) >> 2);
          local_5c[2] = local_58[1] * '@' + local_58[2];
          for (local_55 = 0; local_55 < 3; local_55 = local_55 + 1) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       base64_chars.field_2._8_8_,local_5c + local_55);
          }
          local_55 = 0;
        }
      }
      in_idx = in_idx - 1;
    }
    if (local_55 != 0) {
      for (local_99 = local_55; local_99 < 4; local_99 = local_99 + 1) {
        local_5c[(ulong)local_99 + 3] = '\0';
      }
      for (local_9a = 0; local_9a < 4; local_9a = local_9a + 1) {
        vVar1 = std::__cxx11::string::find
                          ((char)local_40,(ulong)(uint)(int)(char)local_5c[(ulong)local_9a + 3]);
        local_5c[(ulong)local_9a + 3] = vVar1;
      }
      local_5c[0] = local_5c[3] * '\x04' + (char)((int)(local_58[0] & 0x30) >> 4);
      local_5c[1] = local_58[0] * '\x10' + (char)((int)(local_58[1] & 0x3c) >> 2);
      local_5c[2] = local_58[1] * '@' + local_58[2];
      for (local_9b = 0; (int)(uint)local_9b < (int)(local_55 - 1); local_9b = local_9b + 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   base64_chars.field_2._8_8_,local_5c + local_9b);
      }
    }
    std::__cxx11::string::~string(local_40);
    return;
  }
  in_len._6_1_ = 1;
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Base64-encoded data must have size multiply of four.",
             (allocator<char> *)((long)&in_len + 7));
  DeadlyImportError::DeadlyImportError(this_01,&local_80);
  in_len._6_1_ = 0;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AMFImporter::ParseHelper_Decode_Base64(const std::string& pInputBase64, std::vector<uint8_t>& pOutputData) const
{
    // With help from
    // René Nyffenegger http://www.adp-gmbh.ch/cpp/common/base64.html
    const std::string base64_chars = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    uint8_t tidx = 0;
    uint8_t arr4[4], arr3[3];

	// check input data
	if(pInputBase64.size() % 4) throw DeadlyImportError("Base64-encoded data must have size multiply of four.");
	// prepare output place
	pOutputData.clear();
	pOutputData.reserve(pInputBase64.size() / 4 * 3);

	for(size_t in_len = pInputBase64.size(), in_idx = 0; (in_len > 0) && (pInputBase64[in_idx] != '='); in_len--)
	{
		if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx]))
		{
			arr4[tidx++] = pInputBase64[in_idx++];
			if(tidx == 4)
			{
				for(tidx = 0; tidx < 4; tidx++) arr4[tidx] = (uint8_t)base64_chars.find(arr4[tidx]);

				arr3[0] = (arr4[0] << 2) + ((arr4[1] & 0x30) >> 4);
				arr3[1] = ((arr4[1] & 0x0F) << 4) + ((arr4[2] & 0x3C) >> 2);
				arr3[2] = ((arr4[2] & 0x03) << 6) + arr4[3];
				for(tidx = 0; tidx < 3; tidx++) pOutputData.push_back(arr3[tidx]);

				tidx = 0;
			}// if(tidx == 4)
		}// if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx]))
		else
		{
			in_idx++;
		}// if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx])) else
	}

	if(tidx)
	{
		for(uint8_t i = tidx; i < 4; i++) arr4[i] = 0;
		for(uint8_t i = 0; i < 4; i++) arr4[i] = (uint8_t)(base64_chars.find(arr4[i]));

		arr3[0] = (arr4[0] << 2) + ((arr4[1] & 0x30) >> 4);
		arr3[1] = ((arr4[1] & 0x0F) << 4) + ((arr4[2] & 0x3C) >> 2);
		arr3[2] = ((arr4[2] & 0x03) << 6) + arr4[3];
		for(uint8_t i = 0; i < (tidx - 1); i++) pOutputData.push_back(arr3[i]);
	}
}